

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Cec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  Gia_Man_t *p1;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  FILE *pFVar8;
  Gia_Man_t *pGVar9;
  Gia_Man_t *pInit;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  Cec_ParCec_t ParsCec;
  Gia_Man_t *pGias [2];
  char *pFileNames [2];
  Cec_ParCec_t local_7c;
  Gia_Man_t *local_58 [2];
  char *local_48 [3];
  
  local_58[0] = (Gia_Man_t *)0x0;
  local_58[1] = (Gia_Man_t *)0x0;
  Cec_ManCecSetDefaultParams(&local_7c);
  bVar12 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar3 = false;
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"CTnmdasvh"), iVar6 = globalUtilOptind, 0x60 < iVar4)
    {
      switch(iVar4) {
      case 0x6d:
        bVar12 = (bool)(bVar12 ^ 1);
        break;
      case 0x6e:
        local_7c.fNaive = local_7c.fNaive ^ 1;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_0027fbd5_caseD_6f;
      case 0x73:
        local_7c.fSilent = local_7c.fSilent ^ 1;
        break;
      case 0x76:
        local_7c.fVerbose = local_7c.fVerbose ^ 1;
        break;
      default:
        if (iVar4 == 0x61) {
          bVar3 = (bool)(bVar3 ^ 1);
        }
        else {
          if (iVar4 != 100) goto switchD_0027fbd5_caseD_6f;
          bVar2 = (bool)(bVar2 ^ 1);
        }
      }
    }
    if (iVar4 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0027fc96:
        Abc_Print(-1,pcVar10);
        break;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_7c.nBTLimit = uVar5;
    }
    else {
      if (iVar4 != 0x54) {
        if (iVar4 == -1) {
          lVar7 = (long)globalUtilOptind;
          if (bVar12) {
            pGVar9 = pAbc->pGia;
            if (argc == globalUtilOptind && pGVar9 != (Gia_Man_t *)0x0) {
              if (bVar2) {
                if ((pGVar9->vCos->nSize - pGVar9->nRegs & 1U) != 0) {
                  pcVar10 = "The dual-output miter should have an even number of outputs.\n";
                  goto LAB_0027ff79;
                }
                if (local_7c.fSilent == 0) {
                  Abc_Print(1,"Assuming the current network is a double-output miter.\n");
                }
                iVar6 = Cec_ManVerify(pAbc->pGia,&local_7c);
                pAbc->Status = iVar6;
              }
              else {
                if (local_7c.fSilent == 0) {
                  Abc_Print(1,"Assuming the current network is a single-output miter.\n");
                }
                pGVar9 = Gia_ManDemiterToDual(pAbc->pGia);
                iVar6 = Cec_ManVerify(pGVar9,&local_7c);
                pAbc->Status = iVar6;
                pAVar1 = pAbc->pGia->pCexComb;
                pAbc->pGia->pCexComb = pGVar9->pCexComb;
                pGVar9->pCexComb = pAVar1;
                Gia_ManStop(pGVar9);
              }
              Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
              goto LAB_002801f7;
            }
            pcVar10 = 
            "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n"
            ;
          }
          else {
            iVar6 = argc - globalUtilOptind;
            if (iVar6 < 3) {
              if (iVar6 == 2) {
                local_48[0] = argv[lVar7];
                local_48[1] = argv[lVar7 + 1];
                bVar12 = false;
                lVar7 = 0;
                goto LAB_0027fe87;
              }
              pGVar9 = pAbc->pGia;
              if (pGVar9 == (Gia_Man_t *)0x0) {
                pcVar10 = "Abc_CommandAbc9Cec(): There is no current AIG.\n";
              }
              else {
                local_58[0] = pGVar9;
                if (iVar6 == 1) {
                  pcVar10 = argv[lVar7];
                  pcVar11 = pcVar10;
                  goto LAB_00280059;
                }
                if (argc != globalUtilOptind) {
                  __assert_fail("nArgcNew == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                                ,0x9091,"int Abc_CommandAbc9Cec(Abc_Frame_t *, int, char **)");
                }
                pcVar10 = pGVar9->pSpec;
                pcVar11 = pcVar10;
                if (pcVar10 != (char *)0x0) goto LAB_00280059;
                pcVar10 = "File name is not given on the command line.\n";
              }
              bVar12 = false;
              Abc_Print(-1,pcVar10);
              argc = 1;
              pGVar9 = local_58[0];
              p1 = local_58[1];
              goto joined_r0x00280036;
            }
            pcVar10 = "Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n";
          }
LAB_0027ff79:
          iVar6 = -1;
          goto LAB_0027fdd5;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0027fc96;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_7c.TimeLimit = uVar5;
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar5);
switchD_0027fbd5_caseD_6f:
  Abc_Print(-2,"usage: &cec [-CT num] [-nmdasvh]\n");
  Abc_Print(-2,"\t         new combinational equivalence checker\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_7c.nBTLimit);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
            (ulong)(uint)local_7c.TimeLimit);
  pcVar11 = "yes";
  pcVar10 = "yes";
  if (local_7c.fNaive == 0) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar10);
  pcVar10 = "miter";
  if (!bVar12) {
    pcVar10 = "two circuits";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar10);
  pcVar10 = "yes";
  if (!bVar2) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar10);
  pcVar10 = "yes";
  if (!bVar3) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle writing dual-output miter [default = %s]\n",pcVar10);
  pcVar10 = "yes";
  if (local_7c.fSilent == 0) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle silent operation [default = %s]\n",pcVar10);
  if (local_7c.fVerbose == 0) {
    pcVar11 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar11);
  pcVar10 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_0027fdd5:
  Abc_Print(iVar6,pcVar10);
  return 1;
LAB_0027fe87:
  pcVar10 = local_48[lVar7];
  pcVar11 = pcVar10;
  do {
    if (*pcVar11 == '>') {
      *pcVar11 = '\\';
    }
    else if (*pcVar11 == '\0') break;
    pcVar11 = pcVar11 + 1;
  } while( true );
  pFVar8 = fopen(pcVar10,"r");
  if (pFVar8 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar10);
    pcVar10 = Extra_FileGetSimilarName
                        (pcVar10,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    local_48[lVar7] = pcVar10;
    if (pcVar10 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar10);
    }
    argc = 1;
    Abc_Print(1,"\n");
    pGVar9 = local_58[0];
    p1 = local_58[1];
    goto joined_r0x00280036;
  }
  fclose(pFVar8);
  pGVar9 = Gia_AigerRead(pcVar10,0,0,0);
  local_58[lVar7] = pGVar9;
  if (pGVar9 == (Gia_Man_t *)0x0) {
    argc = 0;
    Abc_Print(-1,"Reading AIGER from file \"%s\" has failed.\n",pcVar10);
    pGVar9 = local_58[0];
    p1 = local_58[1];
    goto joined_r0x00280036;
  }
  bVar12 = lVar7 != 0;
  lVar7 = lVar7 + 1;
  pGVar9 = local_58[0];
  p1 = local_58[1];
  if (bVar12) goto joined_r0x00280036;
  goto LAB_0027fe87;
LAB_00280059:
  if (*pcVar10 == '>') {
    *pcVar10 = '\\';
  }
  else if (*pcVar10 == '\0') {
    pFVar8 = fopen(pcVar11,"r");
    if (pFVar8 == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar11);
      pcVar10 = Extra_FileGetSimilarName
                          (pcVar11,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (pcVar10 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar10);
      }
      bVar12 = false;
      argc = 1;
      Abc_Print(1,"\n");
      pGVar9 = local_58[0];
      p1 = local_58[1];
    }
    else {
      fclose(pFVar8);
      argc = 0;
      local_58[1] = Gia_AigerRead(pcVar11,0,0,0);
      if (local_58[1] == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Reading AIGER has failed.\n");
        bVar12 = false;
        pGVar9 = local_58[0];
        p1 = local_58[1];
      }
      else {
        bVar12 = true;
        pGVar9 = local_58[0];
        p1 = local_58[1];
      }
    }
joined_r0x00280036:
    if (bVar12) {
      local_58[0] = pGVar9;
      local_58[1] = p1;
      pInit = Gia_ManMiter(pGVar9,p1,0,1,0,0,local_7c.fVerbose);
      if (pInit != (Gia_Man_t *)0x0) {
        if (bVar3) {
          Abc_Print(0,"The verification miter is written into file \"%s\".\n","cec_miter.aig");
          Gia_AigerWrite(pInit,"cec_miter.aig",0,0,0);
        }
        iVar6 = Cec_ManVerify(pInit,&local_7c);
        pAbc->Status = iVar6;
        Abc_FrameReplaceCex(pAbc,&pGVar9->pCexComb);
        Gia_ManStop(pInit);
      }
      if (pGVar9 != pAbc->pGia) {
        Gia_ManStop(pGVar9);
      }
      Gia_ManStop(p1);
LAB_002801f7:
      argc = 0;
    }
    return argc;
  }
  pcVar10 = pcVar10 + 1;
  goto LAB_00280059;
}

Assistant:

int Abc_CommandAbc9Cec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    FILE * pFile;
    Gia_Man_t * pGias[2] = {NULL, NULL}, * pMiter;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fDumpMiter = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdasvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 'a':
            fDumpMiter ^= 1;
            break;
        case 's':
            pPars->fSilent ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( fMiter )
    {
        if ( pAbc->pGia == NULL || nArgcNew != 0 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n" );
            return 1;
        }
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter.\n" );
            pAbc->Status = Cec_ManVerify( pAbc->pGia, pPars );
        }
        else
        {
            Gia_Man_t * pTemp;
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter.\n" );
            pTemp = Gia_ManDemiterToDual( pAbc->pGia );
            pAbc->Status = Cec_ManVerify( pTemp, pPars );
            ABC_SWAP( Abc_Cex_t *, pAbc->pGia->pCexComb, pTemp->pCexComb );
            Gia_ManStop( pTemp );
        }
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        return 0;
    }
    if ( nArgcNew > 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n" );
        return 1;
    }
    if ( nArgcNew == 2 )
    {
        char * pFileNames[2] = { pArgvNew[0], pArgvNew[1] }, * pTemp;
        int n;
        for ( n = 0; n < 2; n++ )
        {
            // fix the wrong symbol
            for ( pTemp = pFileNames[n]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( pFileNames[n], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", pFileNames[n] );
                if ( (pFileNames[n] = Extra_FileGetSimilarName( pFileNames[n], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", pFileNames[n] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[n] = Gia_AigerRead( pFileNames[n], 0, 0, 0 );
            if ( pGias[n] == NULL )
            {
                Abc_Print( -1, "Reading AIGER from file \"%s\" has failed.\n", pFileNames[n] );
                return 0;
            }
        }
    }
    else
    {
        char * FileName, * pTemp;
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): There is no current AIG.\n" );
            return 1;
        }
        pGias[0] = pAbc->pGia;
        if ( nArgcNew == 1 )
            FileName = pArgvNew[0];
        else
        {
            assert( nArgcNew == 0 );
            if ( pAbc->pGia->pSpec == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
            FileName = pAbc->pGia->pSpec;
        }
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGias[1] = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pGias[1] == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    // compute the miter
    pMiter = Gia_ManMiter( pGias[0], pGias[1], 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pMiter );
    }
    if ( pGias[0] != pAbc->pGia )
        Gia_ManStop( pGias[0] );
    Gia_ManStop( pGias[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: &cec [-CT num] [-nmdasvh]\n" );
    Abc_Print( -2, "\t         new combinational equivalence checker\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-a     : toggle writing dual-output miter [default = %s]\n", fDumpMiter? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle silent operation [default = %s]\n", pPars->fSilent ? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}